

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

Status __thiscall
flatbuffers::anon_unknown_25::CppCodeGenerator::GenerateCode
          (CppCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  bool bVar1;
  string *filename_local;
  string *path_local;
  Parser *parser_local;
  CppCodeGenerator *this_local;
  
  bVar1 = GenerateCPP(parser,path,filename);
  this_local._4_4_ = (Status)!bVar1;
  return this_local._4_4_;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateCPP(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }